

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadImage(ColladaParser *this,Image *pImage)

{
  bool bVar1;
  uint8_t uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  Logger *pLVar6;
  undefined4 extraout_var;
  char *pcVar7;
  reference pvVar8;
  undefined4 extraout_var_00;
  uint local_50;
  uint i;
  uint size;
  char *cur;
  char *data;
  int attrib_1;
  char *sz_1;
  int attrib;
  char *sz;
  Image *pImage_local;
  ColladaParser *this_local;
  
  do {
    do {
      while( true ) {
        uVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar3 & 1) == 0) {
          return;
        }
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar4 != 1) break;
        bVar1 = IsElement(this,"image");
        if (bVar1) {
          SkipElement(this);
        }
        else {
          bVar1 = IsElement(this,"init_from");
          if (bVar1) {
            if (this->mFormat == FV_1_4_n) {
              uVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
              if ((uVar3 & 1) == 0) {
                pcVar7 = TestTextContent(this);
                if (pcVar7 != (char *)0x0) {
                  std::__cxx11::string::operator=((string *)pImage,pcVar7);
                }
                TestClosing(this,"init_from");
              }
              lVar5 = std::__cxx11::string::length();
              if (lVar5 == 0) {
                std::__cxx11::string::operator=((string *)pImage,"unknown_texture");
              }
            }
            else if (this->mFormat == FV_1_5_n) {
              uVar3 = TestAttribute(this,"array_index");
              if ((uVar3 == 0xffffffff) ||
                 (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3),
                 iVar4 < 1)) {
                uVar3 = TestAttribute(this,"mip_index");
                if ((uVar3 != 0xffffffff) &&
                   (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3),
                   0 < iVar4)) {
                  pLVar6 = DefaultLogger::get();
                  Logger::warn(pLVar6,"Collada: Ignoring MIP map layer");
                }
              }
              else {
                pLVar6 = DefaultLogger::get();
                Logger::warn(pLVar6,"Collada: Ignoring texture array index");
              }
            }
          }
          else if (this->mFormat == FV_1_5_n) {
            bVar1 = IsElement(this,"ref");
            if (bVar1) {
              pcVar7 = TestTextContent(this);
              if (pcVar7 != (char *)0x0) {
                std::__cxx11::string::operator=((string *)pImage,pcVar7);
              }
              TestClosing(this,"ref");
            }
            else {
              bVar1 = IsElement(this,"hex");
              if ((bVar1) && (lVar5 = std::__cxx11::string::length(), lVar5 == 0)) {
                uVar3 = TestAttribute(this,"format");
                if (uVar3 == 0xffffffff) {
                  pLVar6 = DefaultLogger::get();
                  Logger::warn(pLVar6,"Collada: Unknown image file format");
                }
                else {
                  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
                  std::__cxx11::string::operator=
                            ((string *)&pImage->mEmbeddedFormat,(char *)CONCAT44(extraout_var,iVar4)
                            );
                }
                pcVar7 = GetTextContent(this);
                _i = pcVar7;
                while (bVar1 = IsSpaceOrNewLine<char>(*_i), ((bVar1 ^ 0xffU) & 1) != 0) {
                  _i = _i + 1;
                }
                uVar3 = ((int)_i - (int)pcVar7) * 2;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&pImage->mImageData,(ulong)uVar3);
                for (local_50 = 0; local_50 < uVar3; local_50 = local_50 + 1) {
                  uVar2 = HexOctetToDecimal(pcVar7 + (local_50 << 1));
                  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     (&pImage->mImageData,(ulong)local_50);
                  *pvVar8 = uVar2;
                }
                TestClosing(this,"hex");
              }
            }
          }
          else {
            SkipElement(this);
          }
        }
      }
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar4 != 2);
    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"image");
  } while (iVar4 != 0);
  return;
}

Assistant:

void ColladaParser::ReadImage(Collada::Image& pImage)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            // Need to run different code paths here, depending on the Collada XSD version
            if (IsElement("image")) {
                SkipElement();
            }
            else if (IsElement("init_from"))
            {
                if (mFormat == FV_1_4_n)
                {
                    // FIX: C4D exporter writes empty <init_from/> tags
                    if (!mReader->isEmptyElement()) {
                        // element content is filename - hopefully
                        const char* sz = TestTextContent();
                        if (sz)pImage.mFileName = sz;
                        TestClosing("init_from");
                    }
                    if (!pImage.mFileName.length()) {
                        pImage.mFileName = "unknown_texture";
                    }
                }
                else if (mFormat == FV_1_5_n)
                {
                    // make sure we skip over mip and array initializations, which
                    // we don't support, but which could confuse the loader if
                    // they're not skipped.
                    int attrib = TestAttribute("array_index");
                    if (attrib != -1 && mReader->getAttributeValueAsInt(attrib) > 0) {
                        ASSIMP_LOG_WARN("Collada: Ignoring texture array index");
                        continue;
                    }

                    attrib = TestAttribute("mip_index");
                    if (attrib != -1 && mReader->getAttributeValueAsInt(attrib) > 0) {
                        ASSIMP_LOG_WARN("Collada: Ignoring MIP map layer");
                        continue;
                    }

                    // TODO: correctly jump over cube and volume maps?
                }
            }
            else if (mFormat == FV_1_5_n)
            {
                if (IsElement("ref"))
                {
                    // element content is filename - hopefully
                    const char* sz = TestTextContent();
                    if (sz)pImage.mFileName = sz;
                    TestClosing("ref");
                }
                else if (IsElement("hex") && !pImage.mFileName.length())
                {
                    // embedded image. get format
                    const int attrib = TestAttribute("format");
                    if (-1 == attrib)
                        ASSIMP_LOG_WARN("Collada: Unknown image file format");
                    else pImage.mEmbeddedFormat = mReader->getAttributeValue(attrib);

                    const char* data = GetTextContent();

                    // hexadecimal-encoded binary octets. First of all, find the
                    // required buffer size to reserve enough storage.
                    const char* cur = data;
                    while (!IsSpaceOrNewLine(*cur)) cur++;

                    const unsigned int size = (unsigned int)(cur - data) * 2;
                    pImage.mImageData.resize(size);
                    for (unsigned int i = 0; i < size; ++i)
                        pImage.mImageData[i] = HexOctetToDecimal(data + (i << 1));

                    TestClosing("hex");
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "image") == 0)
                break;
        }
    }
}